

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall
cmFileCopier::Run(cmFileCopier *this,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *args)

{
  pointer pcVar1;
  cmCommand *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer in_name;
  bool bVar4;
  string fromName;
  string fromFile;
  string toFile;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fromPathComponents;
  string fromDir;
  string local_f8;
  string local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  string *local_40;
  pointer local_38;
  
  iVar3 = (*this->_vptr_cmFileCopier[6])();
  if ((char)iVar3 == '\0') {
    bVar4 = false;
  }
  else {
    in_name = (this->Files).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (this->Files).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = in_name == local_38;
    if (!bVar4) {
      local_40 = &this->FilesFromDir;
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        if ((in_name->_M_string_length == 0) ||
           (bVar2 = cmsys::SystemTools::FileIsFullPath(in_name), bVar2)) {
          if ((this->FilesFromDir)._M_string_length != 0) {
            this_00 = &this->FileCommand->super_cmCommand;
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f8,
                       "option FILES_FROM_DIR requires all files to be specified as relative paths."
                       ,"");
            cmCommand::SetError(this_00,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p == &local_98.field_2) {
              return bVar4;
            }
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
            return bVar4;
          }
          std::__cxx11::string::_M_assign((string *)&local_98);
        }
        else {
          if ((this->FilesFromDir)._M_string_length == 0) {
            cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
          }
          std::__cxx11::string::_M_assign((string *)&local_98);
          std::__cxx11::string::append((char *)&local_98);
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)(in_name->_M_dataplus)._M_p);
        }
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmsys::SystemTools::SplitPath(&local_98,&local_78,true);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        pcVar1 = local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,pcVar1,
                   pcVar1 + local_78.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length);
        cmsys::SystemTools::JoinPath
                  (&local_60,
                   (const_iterator)
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        local_b8[0] = local_a8;
        pcVar1 = (this->Destination)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,pcVar1,pcVar1 + (this->Destination)._M_string_length);
        if ((this->FilesFromDir)._M_string_length != 0) {
          cmsys::SystemTools::GetFilenamePath(&local_d8,in_name);
          if (local_d8._M_string_length != 0) {
            std::__cxx11::string::append((char *)local_b8);
            std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        iVar3 = (*this->_vptr_cmFileCopier[3])(this,&local_f8);
        if (((ulong *)CONCAT44(extraout_var,iVar3))[1] != 0) {
          std::__cxx11::string::append((char *)local_b8);
          std::__cxx11::string::_M_append((char *)local_b8,*(ulong *)CONCAT44(extraout_var,iVar3));
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_60._M_dataplus._M_p,
                   local_60._M_dataplus._M_p + local_60._M_string_length);
        if (local_f8._M_string_length != 0) {
          std::__cxx11::string::append((char *)&local_d8);
          std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
        }
        iVar3 = (*this->_vptr_cmFileCopier[2])(this,&local_d8,local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
        if ((char)iVar3 == '\0') {
          return bVar4;
        }
        in_name = in_name + 1;
        bVar4 = in_name == local_38;
      } while (!bVar4);
    }
  }
  return bVar4;
}

Assistant:

bool cmFileCopier::Run(std::vector<std::string> const& args)
{
  if (!this->Parse(args)) {
    return false;
  }

  for (std::string const& f : this->Files) {
    std::string file;
    if (!f.empty() && !cmSystemTools::FileIsFullPath(f)) {
      if (!this->FilesFromDir.empty()) {
        file = this->FilesFromDir;
      } else {
        file = this->Makefile->GetCurrentSourceDirectory();
      }
      file += "/";
      file += f;
    } else if (!this->FilesFromDir.empty()) {
      this->FileCommand->SetError("option FILES_FROM_DIR requires all files "
                                  "to be specified as relative paths.");
      return false;
    } else {
      file = f;
    }

    // Split the input file into its directory and name components.
    std::vector<std::string> fromPathComponents;
    cmSystemTools::SplitPath(file, fromPathComponents);
    std::string fromName = *(fromPathComponents.end() - 1);
    std::string fromDir = cmSystemTools::JoinPath(
      fromPathComponents.begin(), fromPathComponents.end() - 1);

    // Compute the full path to the destination file.
    std::string toFile = this->Destination;
    if (!this->FilesFromDir.empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(f);
      if (!dir.empty()) {
        toFile += "/";
        toFile += dir;
      }
    }
    std::string const& toName = this->ToName(fromName);
    if (!toName.empty()) {
      toFile += "/";
      toFile += toName;
    }

    // Construct the full path to the source file.  The file name may
    // have been changed above.
    std::string fromFile = fromDir;
    if (!fromName.empty()) {
      fromFile += "/";
      fromFile += fromName;
    }

    if (!this->Install(fromFile, toFile)) {
      return false;
    }
  }
  return true;
}